

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Attribute::set_var(Attribute *this,PrimVar *v)

{
  ulong uVar1;
  string local_38;
  PrimVar *local_18;
  PrimVar *v_local;
  Attribute *this_local;
  
  local_18 = v;
  v_local = (PrimVar *)this;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    primvar::PrimVar::type_name_abi_cxx11_(&local_38,local_18);
    ::std::__cxx11::string::operator=((string *)&this->_type_name,(string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  primvar::PrimVar::operator=(&this->_var,local_18);
  return;
}

Assistant:

void set_var(primvar::PrimVar &&v) {
    if (_type_name.empty()) {
      _type_name = v.type_name();
    }

    _var = std::move(v);
  }